

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

bool __thiscall FlowGraph::CanonicalizeLoops(FlowGraph *this)

{
  Loop *pLVar1;
  bool bVar2;
  bool bVar3;
  ImplicitCallFlags IVar4;
  ImplicitCallFlags IVar5;
  bool bVar6;
  BOOL BVar7;
  JITTimeProfileInfo *this_00;
  Loop **ppLVar8;
  
  bVar3 = Func::HasProfileInfo(this->func);
  if (bVar3) {
    this_00 = Func::GetReadOnlyProfileInfo(this->func);
    IVar4 = JITTimeProfileInfo::GetImplicitCallFlags(this_00);
    this->implicitCallFlags = IVar4;
    ppLVar8 = &this->loopList;
    while (pLVar1 = *ppLVar8, pLVar1 != (Loop *)0x0) {
      IVar5 = Loop::GetImplicitCallFlags(pLVar1);
      IVar4 = IVar4 | IVar5;
      this->implicitCallFlags = IVar4;
      ppLVar8 = &pLVar1->next;
    }
  }
  Dump(this,true,L"\n Before canonicalizeLoops \n");
  ppLVar8 = &this->loopList;
  bVar3 = false;
  do {
    pLVar1 = *ppLVar8;
    if (pLVar1 == (Loop *)0x0) {
      Dump(this,true,L"\n After canonicalizeLoops \n");
      return bVar3;
    }
    Loop::InsertLandingPad(pLVar1,this);
    BVar7 = Func::HasTry(this->func);
    bVar2 = bVar3;
    if (BVar7 == 0) {
LAB_003f8738:
      bVar6 = Loop::RemoveBreakBlocks(pLVar1,this);
      if (bVar6) {
        bVar2 = true;
      }
      if (bVar3) {
        bVar2 = bVar3;
      }
    }
    else {
      bVar6 = Func::DoOptimizeTry(this->func);
      if (bVar6) goto LAB_003f8738;
    }
    bVar3 = bVar2;
    ppLVar8 = &pLVar1->next;
  } while( true );
}

Assistant:

bool
FlowGraph::CanonicalizeLoops()
{
    if (this->func->HasProfileInfo())
    {
        this->implicitCallFlags = this->func->GetReadOnlyProfileInfo()->GetImplicitCallFlags();
        for (Loop *loop = this->loopList; loop; loop = loop->next)
        {
            this->implicitCallFlags = (Js::ImplicitCallFlags)(this->implicitCallFlags | loop->GetImplicitCallFlags());
        }
    }

#if DBG_DUMP
    this->Dump(true, _u("\n Before canonicalizeLoops \n"));
#endif

    bool breakBlockRelocated = false;

    for (Loop *loop = this->loopList; loop; loop = loop->next)
    {
        loop->InsertLandingPad(this);
        if (!this->func->HasTry() || this->func->DoOptimizeTry())
        {
            bool relocated = loop->RemoveBreakBlocks(this);
            if (!breakBlockRelocated && relocated)
            {
                breakBlockRelocated  = true;
            }
        }
    }

#if DBG_DUMP
    this->Dump(true, _u("\n After canonicalizeLoops \n"));
#endif

    return breakBlockRelocated;
}